

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::createExtra(QWidgetPrivate *this)

{
  ushort *puVar1;
  _Head_base<0UL,_QWExtra_*,_false> _Var2;
  _Head_base<0UL,_QWExtra_*,_false> _Var3;
  unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *this_00;
  pointer __p;
  long in_FS_OFFSET;
  QWExtra *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
      super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
      super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl == (QWExtra *)0x0) {
    this_00 = &this->extra;
    _Var3._M_head_impl = (QWExtra *)operator_new(0x80);
    (_Var3._M_head_impl)->glContext = (void *)0x0;
    ((_Var3._M_head_impl)->topextra)._M_t =
         (__uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true>)0x0;
    (_Var3._M_head_impl)->proxyWidget = (QGraphicsProxyWidget *)0x0;
    ((_Var3._M_head_impl)->curs)._M_t =
         (__uniq_ptr_data<QCursor,_std::default_delete<QCursor>,_true,_true>)0x0;
    ((_Var3._M_head_impl)->style).wp.d = 0;
    *(QObject **)((long)&(_Var3._M_head_impl)->style + 8) = (QObject *)0x0;
    ((_Var3._M_head_impl)->focus_proxy).wp.d = 0;
    *(QObject **)((long)&(_Var3._M_head_impl)->focus_proxy + 8) = (QObject *)0x0;
    ((_Var3._M_head_impl)->mask).d = (QRegionData *)0x0;
    ((_Var3._M_head_impl)->styleSheet).d.d = 0;
    *(char16_t **)((long)&(_Var3._M_head_impl)->styleSheet + 8) = (char16_t *)0x0;
    *(qsizetype *)((long)&(_Var3._M_head_impl)->styleSheet + 0x10) = 0;
    (_Var3._M_head_impl)->minw = 0;
    (_Var3._M_head_impl)->minh = 0;
    (_Var3._M_head_impl)->maxw = 0;
    (_Var3._M_head_impl)->maxh = 0;
    (_Var3._M_head_impl)->customDpiX = 0;
    (_Var3._M_head_impl)->customDpiY = 0;
    ((_Var3._M_head_impl)->staticContentsSize).wd = 0;
    *(undefined8 *)((long)&(_Var3._M_head_impl)->staticContentsSize + 4) = 0;
    QRegion::QRegion(&(_Var3._M_head_impl)->mask);
    *(qsizetype *)((long)&(_Var3._M_head_impl)->styleSheet + 0x10) = 0;
    ((_Var3._M_head_impl)->styleSheet).d.d = 0;
    *(char16_t **)((long)&(_Var3._M_head_impl)->styleSheet + 8) = (char16_t *)0x0;
    ((_Var3._M_head_impl)->staticContentsSize).wd = -1;
    ((_Var3._M_head_impl)->staticContentsSize).ht = -1;
    local_20 = (QWExtra *)0x0;
    _Var2._M_head_impl =
         (this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
         super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
         super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    (this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
    super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
    super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl = _Var3._M_head_impl;
    if (_Var2._M_head_impl != (QWExtra *)0x0) {
      std::default_delete<QWExtra>::operator()
                ((default_delete<QWExtra> *)this_00,_Var2._M_head_impl);
    }
    if (local_20 != (QWExtra *)0x0) {
      std::default_delete<QWExtra>::operator()((default_delete<QWExtra> *)&local_20,local_20);
    }
    ((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
     super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
     super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->glContext = (void *)0x0;
    ((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
     super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
     super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->proxyWidget =
         (QGraphicsProxyWidget *)0x0;
    _Var2._M_head_impl =
         (this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
         super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
         super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    (_Var2._M_head_impl)->minw = 0;
    (_Var2._M_head_impl)->minh = 0;
    (_Var2._M_head_impl)->maxw = 0xffffff;
    (_Var2._M_head_impl)->maxh = 0xffffff;
    (_Var2._M_head_impl)->customDpiX = 0;
    (_Var2._M_head_impl)->customDpiY = 0;
    (_Var2._M_head_impl)->field_0x7c = (_Var2._M_head_impl)->field_0x7c & 0xfc;
    puVar1 = (ushort *)
             &((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
    *puVar1 = *puVar1 & 0xfff3;
    puVar1 = (ushort *)
             &((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
    *puVar1 = *puVar1 & 0xffef;
    puVar1 = (ushort *)
             &((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
    *puVar1 = *puVar1 & 0xffdf;
    puVar1 = (ushort *)
             &((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
    *puVar1 = *puVar1 & 0xffbf;
    puVar1 = (ushort *)
             &((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
    *puVar1 = *puVar1 & 0xfeff;
    puVar1 = (ushort *)
             &((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
    *puVar1 = *puVar1 & 0xff7f;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::createExtra()
{
    if (!extra) {                                // if not exists
        extra = std::make_unique<QWExtra>();
        extra->glContext = nullptr;
#if QT_CONFIG(graphicsview)
        extra->proxyWidget = nullptr;
#endif
        extra->minw = 0;
        extra->minh = 0;
        extra->maxw = QWIDGETSIZE_MAX;
        extra->maxh = QWIDGETSIZE_MAX;
        extra->customDpiX = 0;
        extra->customDpiY = 0;
        extra->explicitMinSize = 0;
        extra->explicitMaxSize = 0;
        extra->autoFillBackground = 0;
        extra->nativeChildrenForced = 0;
        extra->inRenderWithPainter = 0;
        extra->hasWindowContainer = false;
        extra->hasMask = 0;
        createSysExtra();
#ifdef QWIDGET_EXTRA_DEBUG
        static int count = 0;
        qDebug() << "extra" << ++count;
#endif
    }
}